

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart.hpp
# Opt level: O2

Lazy<cinatra::chunked_result> __thiscall
cinatra::multipart_reader_t<cinatra::coro_http_client>::read_part_body
          (multipart_reader_t<cinatra::coro_http_client> *this,string_view boundary)

{
  coro_http_client *pcVar1;
  size_t in_RCX;
  
  pcVar1 = (coro_http_client *)operator_new(0xd8,(nothrow_t *)&std::nothrow);
  if (pcVar1 == (coro_http_client *)0x0) {
    this->conn_ = (coro_http_client *)0x0;
  }
  else {
    (pcVar1->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)read_part_body;
    (pcVar1->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)read_part_body;
    (pcVar1->parser_).headers_._M_elems[3].value._M_len = in_RCX;
    (pcVar1->parser_).headers_._M_elems[3].name._M_str = boundary._M_str;
    (pcVar1->parser_).headers_._M_elems[3].name._M_len = boundary._M_len;
    *(undefined8 *)&pcVar1->parser_ = 0;
    (pcVar1->parser_).msg_._M_len = 0;
    (pcVar1->parser_).msg_._M_str = (char *)0x0;
    *(undefined1 *)&(pcVar1->parser_).headers_._M_elems[0].name._M_str = 0;
    this->conn_ = pcVar1;
    *(undefined1 *)((long)&(pcVar1->parser_).headers_._M_elems[4].name._M_str + 4) = 0;
  }
  return (LazyBase<cinatra::chunked_result,_false>)(LazyBase<cinatra::chunked_result,_false>)this;
}

Assistant:

async_simple::coro::Lazy<chunked_result> read_part_body(
      std::string_view boundary) {
    chunked_result result{};
    std::error_code ec{};
    size_t size = 0;

    if (std::tie(ec, size) =
            co_await conn_->async_read_until(chunked_buf_, boundary);
        ec) {
      result.ec = ec;
      conn_->close();
      co_return result;
    }

    const char *data_ptr = asio::buffer_cast<const char *>(chunked_buf_.data());
    chunked_buf_.consume(size);
    result.data = std::string_view{
        data_ptr, size - boundary.size() - 4};  //-- boundary \r\n

    if (std::tie(ec, size) =
            co_await conn_->async_read_until(chunked_buf_, CRCF);
        ec) {
      result = {};
      result.ec = ec;
      conn_->close();
      co_return result;
    }

    data_ptr = asio::buffer_cast<const char *>(chunked_buf_.data());
    std::string data{data_ptr, size};
    if (size > 2) {
      constexpr std::string_view complete_flag = "--\r\n";
      if (data == complete_flag) {
        result.eof = true;
      }
    }

    chunked_buf_.consume(size);
    co_return result;
  }